

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselector_tests.cpp
# Opt level: O0

void wallet::coinselector_tests::add_coin
               (CAmount *nValue,int nInput,
               vector<wallet::COutput,_std::allocator<wallet::COutput>_> *set)

{
  long lVar1;
  reference pvVar2;
  COutPoint *in_RDX;
  undefined4 in_ESI;
  CAmount *in_RDI;
  long in_FS_OFFSET;
  CMutableTransaction tx;
  CMutableTransaction *in_stack_fffffffffffffee8;
  uint32_t nIn;
  CMutableTransaction *this;
  Txid *in_stack_fffffffffffffef0;
  COutPoint *in_stack_fffffffffffffef8;
  size_type in_stack_ffffffffffffff00;
  CMutableTransaction *in_stack_ffffffffffffff08;
  bool *__args_4;
  int *in_stack_ffffffffffffff38;
  CTxOut *in_stack_ffffffffffffff40;
  COutPoint *__args;
  undefined4 in_stack_ffffffffffffff50;
  undefined1 local_92;
  undefined1 local_91;
  undefined4 local_90;
  undefined4 local_8c;
  bool *in_stack_ffffffffffffff80;
  bool *in_stack_ffffffffffffff88;
  int *in_stack_ffffffffffffff90;
  bool *in_stack_ffffffffffffff98;
  int *in_stack_ffffffffffffffa0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CMutableTransaction::CMutableTransaction(in_stack_fffffffffffffee8);
  nIn = (uint32_t)((ulong)in_stack_fffffffffffffee8 >> 0x20);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffff08,
             in_stack_ffffffffffffff00);
  __args_4 = (bool *)*in_RDI;
  pvVar2 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                     ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffffef8,
                      (size_type)in_stack_fffffffffffffef0);
  pvVar2->nValue = (CAmount)__args_4;
  nextLockTime = nextLockTime + 1;
  __args = in_RDX;
  CMutableTransaction::GetHash(in_stack_ffffffffffffff08);
  COutPoint::COutPoint(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,nIn);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::at
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffffef8,
             (size_type)in_stack_fffffffffffffef0);
  local_8c = 1;
  local_90 = 0xffffffff;
  local_91 = 1;
  local_92 = 1;
  this = (CMutableTransaction *)&local_92;
  std::vector<wallet::COutput,std::allocator<wallet::COutput>>::
  emplace_back<COutPoint,CTxOut&,int,int,bool,bool,bool,int,bool,int>
            ((vector<wallet::COutput,_std::allocator<wallet::COutput>_> *)
             CONCAT44(in_ESI,in_stack_ffffffffffffff50),__args,in_stack_ffffffffffffff40,
             in_stack_ffffffffffffff38,(int *)in_RDX,__args_4,in_stack_ffffffffffffff80,
             in_stack_ffffffffffffff88,in_stack_ffffffffffffff90,in_stack_ffffffffffffff98,
             in_stack_ffffffffffffffa0);
  CMutableTransaction::~CMutableTransaction(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void add_coin(const CAmount& nValue, int nInput, std::vector<COutput>& set)
{
    CMutableTransaction tx;
    tx.vout.resize(nInput + 1);
    tx.vout[nInput].nValue = nValue;
    tx.nLockTime = nextLockTime++;        // so all transactions get different hashes
    set.emplace_back(COutPoint(tx.GetHash(), nInput), tx.vout.at(nInput), /*depth=*/ 1, /*input_bytes=*/ -1, /*spendable=*/ true, /*solvable=*/ true, /*safe=*/ true, /*time=*/ 0, /*from_me=*/ false, /*fees=*/ 0);
}